

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

bool jessilib::equalsi<char32_t,char32_t>
               (basic_string_view<char32_t,_std::char_traits<char32_t>_> lhs,
               basic_string_view<char32_t,_std::char_traits<char32_t>_> rhs)

{
  wchar32 wVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  
  sVar5 = lhs._M_len;
  if (sVar5 != rhs._M_len) {
    return false;
  }
  if (sVar5 != 0) {
    sVar4 = 0;
    do {
      if (sVar5 == sVar4) {
        return false;
      }
      wVar1 = rhs._M_str[sVar4];
      if (lhs._M_str[sVar4] != wVar1) {
        iVar2 = jessilib::fold(lhs._M_str[sVar4]);
        iVar3 = jessilib::fold(wVar1);
        if (iVar2 != iVar3) {
          return false;
        }
      }
      sVar4 = sVar4 + 1;
    } while (sVar5 != sVar4);
  }
  return true;
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}